

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O2

int Saig_ManDemiter(Aig_Man_t *p,Aig_Man_t **ppAig0,Aig_Man_t **ppAig1)

{
  int iVar1;
  Vec_Ptr_t *p_00;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *p_01;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Vec_Ptr_t *local_58;
  Vec_Ptr_t *local_50;
  int local_44;
  Aig_Man_t **local_40;
  Aig_Man_t **local_38;
  
  local_40 = ppAig1;
  local_38 = ppAig0;
  if (p->nRegs < 1) {
    __assert_fail("Saig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                  ,0x38c,"int Saig_ManDemiter(Aig_Man_t *, Aig_Man_t **, Aig_Man_t **)");
  }
  Aig_ManSetCioIds(p);
  p_00 = Vec_PtrAlloc(p->nTruePos * 2);
  iVar8 = 0;
  do {
    if (p->nTruePos <= iVar8) {
      pVVar3 = Vec_PtrAlloc(p->nTruePos);
      p_01 = Vec_PtrAlloc(p->nTruePos);
      pObj0 = (Aig_Obj_t *)Vec_PtrEntry(p_00,0);
      pObj1 = (Aig_Obj_t *)Vec_PtrEntry(p_00,1);
      Aig_ManIncrementTravId(p);
      Saig_ManDemiterLabel_rec(p,(Aig_Obj_t *)((ulong)pObj0 & 0xfffffffffffffffe),0);
      local_50 = pVVar3;
      Vec_PtrPush(pVVar3,pObj0);
      Aig_ManIncrementTravId(p);
      Saig_ManDemiterLabel_rec(p,(Aig_Obj_t *)((ulong)pObj1 & 0xfffffffffffffffe),1);
      local_58 = p_01;
      Vec_PtrPush(p_01,pObj1);
      local_44 = p_00->nSize;
      uVar9 = 1;
      for (iVar8 = 2; iVar8 < local_44; iVar8 = iVar8 + 2) {
        pObj0 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar8);
        pObj1 = (Aig_Obj_t *)Vec_PtrEntry(p_00,iVar8 + 1);
        Aig_ManIncrementTravId(p);
        pAVar4 = Saig_ManGetLabeledRegister_rec(p,(Aig_Obj_t *)((ulong)pObj0 & 0xfffffffffffffffe));
        Aig_ManIncrementTravId(p);
        pAVar5 = Saig_ManGetLabeledRegister_rec(p,(Aig_Obj_t *)((ulong)pObj1 & 0xfffffffffffffffe));
        uVar6 = *(ulong *)&pAVar4->field_0x18;
        uVar7 = (uint)uVar6 & 0x30;
        if (((uVar7 == 0x30) || ((~*(uint *)&pAVar5->field_0x18 & 0x30) == 0)) ||
           ((uVar7 & *(uint *)&pAVar5->field_0x18) != 0)) {
          printf("Ouput pair %4d: Difficult case...\n",uVar9);
          uVar6 = *(ulong *)&pAVar4->field_0x18;
        }
        if ((uVar6 & 0x20) == 0) {
          Saig_ManDemiterLabel_rec(p,pObj0,0);
          pVVar3 = local_58;
        }
        else {
          Saig_ManDemiterLabel_rec(p,pObj0,1);
          pVVar3 = local_50;
        }
        Vec_PtrPush(pVVar3,pObj0);
        if ((pAVar5->field_0x18 & 0x20) == 0) {
          Saig_ManDemiterLabel_rec(p,pObj1,0);
          pVVar3 = local_58;
        }
        else {
          Saig_ManDemiterLabel_rec(p,pObj1,1);
          pVVar3 = local_50;
        }
        Vec_PtrPush(pVVar3,pObj1);
        uVar9 = (ulong)((int)uVar9 + 1);
      }
      uVar7 = 0;
      for (iVar8 = 0; iVar8 < p->nRegs; iVar8 = iVar8 + 1) {
        pvVar2 = Vec_PtrEntry(p->vCis,p->nTruePis + iVar8);
        uVar7 = uVar7 + ((~*(uint *)((long)pvVar2 + 0x18) & 0x30) == 0);
      }
      if (uVar7 != 0) {
        printf("The miters contains %d flops reachable from both AIGs.\n",(ulong)uVar7);
      }
      if (local_38 != (Aig_Man_t **)0x0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                      ,0x3d8,"int Saig_ManDemiter(Aig_Man_t *, Aig_Man_t **, Aig_Man_t **)");
      }
      if (local_40 != (Aig_Man_t **)0x0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/saig/saigMiter.c"
                      ,0x3df,"int Saig_ManDemiter(Aig_Man_t *, Aig_Man_t **, Aig_Man_t **)");
      }
      Vec_PtrFree(local_50);
      Vec_PtrFree(local_58);
      iVar8 = 1;
LAB_00544cc2:
      Vec_PtrFree(p_00);
      return iVar8;
    }
    pvVar2 = Vec_PtrEntry(p->vCos,iVar8);
    iVar1 = Aig_ObjRecognizeExor
                      ((Aig_Obj_t *)(*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe),&pObj0,
                       &pObj1);
    if (iVar1 == 0) {
      iVar8 = 0;
      goto LAB_00544cc2;
    }
    Vec_PtrPush(p_00,pObj0);
    Vec_PtrPush(p_00,pObj1);
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

int Saig_ManDemiter( Aig_Man_t * p, Aig_Man_t ** ppAig0, Aig_Man_t ** ppAig1 )
{
    Vec_Ptr_t * vPairs, * vSet0, * vSet1;
    Aig_Obj_t * pObj, * pObj0, * pObj1, * pFlop0, * pFlop1;
    int i, Counter;
    assert( Saig_ManRegNum(p) > 0 );
    Aig_ManSetCioIds( p );
    // check if demitering is possible
    vPairs = Vec_PtrAlloc( 2 * Saig_ManPoNum(p) );
    Saig_ManForEachPo( p, pObj, i )
    {
        if ( !Aig_ObjRecognizeExor( Aig_ObjFanin0(pObj), &pObj0, &pObj1 ) )
        {
            Vec_PtrFree( vPairs );
            return 0;
        }
        Vec_PtrPush( vPairs, pObj0 );
        Vec_PtrPush( vPairs, pObj1 );
    }
    // start array of outputs
    vSet0 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    vSet1 = Vec_PtrAlloc( Saig_ManPoNum(p) );
    // get the first pair of outputs
    pObj0 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, 0 );
    pObj1 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, 1 );
    // label registers reachable from the outputs
    Aig_ManIncrementTravId( p );
    Saig_ManDemiterLabel_rec( p, Aig_Regular(pObj0), 0 );
    Vec_PtrPush( vSet0, pObj0 );
    Aig_ManIncrementTravId( p );
    Saig_ManDemiterLabel_rec( p, Aig_Regular(pObj1), 1 );
    Vec_PtrPush( vSet1, pObj1 );
    // find where each output belongs
    for ( i = 2; i < Vec_PtrSize(vPairs); i += 2 )
    {
        pObj0 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, i   );
        pObj1 = (Aig_Obj_t *)Vec_PtrEntry( vPairs, i+1 );

        Aig_ManIncrementTravId( p );
        pFlop0 = Saig_ManGetLabeledRegister_rec( p, Aig_Regular(pObj0) );

        Aig_ManIncrementTravId( p );
        pFlop1 = Saig_ManGetLabeledRegister_rec( p, Aig_Regular(pObj1) );

        if ( (pFlop0->fMarkA && pFlop0->fMarkB) || (pFlop1->fMarkA && pFlop1->fMarkB) || 
             (pFlop0->fMarkA && pFlop1->fMarkA) || (pFlop0->fMarkB && pFlop1->fMarkB)  )
            printf( "Ouput pair %4d: Difficult case...\n", i/2 );

        if ( pFlop0->fMarkB )
        {
            Saig_ManDemiterLabel_rec( p, pObj0, 1 );
            Vec_PtrPush( vSet0, pObj0 );
        }
        else // if ( pFlop0->fMarkA ) or none
        {
            Saig_ManDemiterLabel_rec( p, pObj0, 0 );
            Vec_PtrPush( vSet1, pObj0 );
        }

        if ( pFlop1->fMarkB )
        {
            Saig_ManDemiterLabel_rec( p, pObj1, 1 );
            Vec_PtrPush( vSet0, pObj1 );
        }
        else // if ( pFlop1->fMarkA ) or none
        {
            Saig_ManDemiterLabel_rec( p, pObj1, 0 );
            Vec_PtrPush( vSet1, pObj1 );
        }
    }
    // check if there are any flops in common
    Counter = 0;
    Saig_ManForEachLo( p, pObj, i )
        if ( pObj->fMarkA && pObj->fMarkB )
            Counter++;
    if ( Counter > 0 )
        printf( "The miters contains %d flops reachable from both AIGs.\n", Counter );

    // produce two miters
    if ( ppAig0 )
    {
        assert( 0 );
        *ppAig0 = Aig_ManDupNodesHalf( p, vSet0, 0 ); // not ready
        ABC_FREE( (*ppAig0)->pName );
        (*ppAig0)->pName = Abc_UtilStrsav( "part0" );
    }
    if ( ppAig1 )
    {
        assert( 0 );
        *ppAig1 = Aig_ManDupNodesHalf( p, vSet1, 1 ); // not ready
        ABC_FREE( (*ppAig1)->pName );
        (*ppAig1)->pName = Abc_UtilStrsav( "part1" );
    }
    Vec_PtrFree( vSet0 );
    Vec_PtrFree( vSet1 );
    Vec_PtrFree( vPairs );
    return 1;
}